

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_set_all_gej_var(secp256k1_ge *r,secp256k1_gej *a,size_t len)

{
  uint64_t *puVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int *piVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  secp256k1_ge *psVar10;
  secp256k1_fe *b;
  bool bVar11;
  secp256k1_fe u;
  
  b = &a->z;
  sVar9 = 0xffffffffffffffff;
  psVar10 = r;
  for (sVar7 = 0; len != sVar7; sVar7 = sVar7 + 1) {
    if (*(int *)(b + 1) == 0) {
      if (sVar9 == 0xffffffffffffffff) {
        (psVar10->x).n[4] = b->n[4];
        uVar3 = b->n[0];
        uVar4 = b->n[1];
        uVar5 = b->n[3];
        (psVar10->x).n[2] = b->n[2];
        (psVar10->x).n[3] = uVar5;
        (psVar10->x).n[0] = uVar3;
        (psVar10->x).n[1] = uVar4;
        sVar9 = sVar7;
      }
      else {
        secp256k1_fe_impl_mul(&psVar10->x,&r[sVar9].x,b);
        sVar9 = sVar7;
      }
    }
    else {
      psVar10->infinity = 1;
      (psVar10->x).n[0] = 0;
      (psVar10->x).n[1] = 0;
      (psVar10->x).n[2] = 0;
      (psVar10->x).n[3] = 0;
      (psVar10->x).n[4] = 0;
      (psVar10->y).n[0] = 0;
      (psVar10->y).n[1] = 0;
      (psVar10->y).n[2] = 0;
      (psVar10->y).n[3] = 0;
      (psVar10->y).n[4] = 0;
    }
    b = (secp256k1_fe *)((long)(b + 3) + 8);
    psVar10 = psVar10 + 1;
  }
  if (sVar9 != 0xffffffffffffffff) {
    secp256k1_fe_impl_inv_var(&u,&r[sVar9].x);
    do {
      lVar8 = -sVar9;
      psVar10 = r + sVar9;
      piVar6 = &a[sVar9 - 1].infinity;
      do {
        lVar8 = lVar8 + 1;
        if (lVar8 == 1) {
          r[sVar9].x.n[4] = u.n[4];
          puVar1 = r[sVar9].x.n + 2;
          *puVar1 = u.n[2];
          puVar1[1] = u.n[3];
          r[sVar9].x.n[0] = u.n[0];
          r[sVar9].x.n[1] = u.n[1];
          while (bVar11 = len != 0, len = len - 1, bVar11) {
            if (a->infinity == 0) {
              secp256k1_ge_set_gej_zinv(r,a,&r->x);
            }
            a = a + 1;
            r = r + 1;
          }
          return;
        }
        psVar10 = psVar10 + -1;
        iVar2 = *piVar6;
        piVar6 = piVar6 + -0x20;
      } while (iVar2 != 0);
      secp256k1_fe_impl_mul(&r[sVar9].x,&psVar10->x,&u);
      secp256k1_fe_impl_mul(&u,&u,&a[sVar9].z);
      sVar9 = -lVar8;
    } while( true );
  }
  return;
}

Assistant:

static void secp256k1_ge_set_all_gej_var(secp256k1_ge *r, const secp256k1_gej *a, size_t len) {
    secp256k1_fe u;
    size_t i;
    size_t last_i = SIZE_MAX;
#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GEJ_VERIFY(&a[i]);
    }
#endif

    for (i = 0; i < len; i++) {
        if (a[i].infinity) {
            secp256k1_ge_set_infinity(&r[i]);
        } else {
            /* Use destination's x coordinates as scratch space */
            if (last_i == SIZE_MAX) {
                r[i].x = a[i].z;
            } else {
                secp256k1_fe_mul(&r[i].x, &r[last_i].x, &a[i].z);
            }
            last_i = i;
        }
    }
    if (last_i == SIZE_MAX) {
        return;
    }
    secp256k1_fe_inv_var(&u, &r[last_i].x);

    i = last_i;
    while (i > 0) {
        i--;
        if (!a[i].infinity) {
            secp256k1_fe_mul(&r[last_i].x, &r[i].x, &u);
            secp256k1_fe_mul(&u, &u, &a[last_i].z);
            last_i = i;
        }
    }
    VERIFY_CHECK(!a[last_i].infinity);
    r[last_i].x = u;

    for (i = 0; i < len; i++) {
        if (!a[i].infinity) {
            secp256k1_ge_set_gej_zinv(&r[i], &a[i], &r[i].x);
        }
    }

#ifdef VERIFY
    for (i = 0; i < len; i++) {
        SECP256K1_GE_VERIFY(&r[i]);
    }
#endif
}